

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsview.cpp
# Opt level: O2

void __thiscall
QGraphicsView::render
          (QGraphicsView *this,QPainter *painter,QRectF *target,QRect *source,
          AspectRatioMode aspectRatioMode)

{
  undefined8 uVar1;
  long lVar2;
  QGraphicsViewPrivate *this_00;
  QGraphicsScene *this_01;
  QGraphicsItemPrivate *this_02;
  qsizetype qVar3;
  bool bVar4;
  char cVar5;
  int iVar6;
  QWidget *this_03;
  long *plVar7;
  void *pvVar8;
  ulong uVar9;
  qint64 qVar10;
  qint64 qVar11;
  QTransform *pQVar12;
  QStyleOptionGraphicsItem *array;
  long lVar13;
  long lVar14;
  Representation RVar15;
  Representation RVar16;
  QStyleOptionGraphicsItem *option;
  qreal *pqVar17;
  undefined8 *puVar18;
  QRect *pQVar19;
  ulong uVar20;
  int iVar21;
  int i;
  long in_FS_OFFSET;
  byte bVar22;
  double dVar23;
  double dVar24;
  QRect QVar25;
  double local_1d8;
  double local_1d0;
  QPainterPath path;
  QArrayDataPointer<QGraphicsItem_*> local_188;
  QArrayDataPointer<QPointF> local_168;
  QRectF local_148;
  QRect local_128;
  undefined4 local_118;
  undefined4 uStack_114;
  undefined4 uStack_110;
  undefined4 uStack_10c;
  undefined2 local_e0;
  QTransform painterMatrix;
  QTransform moveMatrix;
  
  bVar22 = 0;
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QGraphicsViewPrivate **)(this + 8);
  bVar4 = QPointer::operator_cast_to_bool((QPointer *)&this_00->scene);
  if ((painter != (QPainter *)0x0 && bVar4) && (cVar5 = QPainter::isActive(), cVar5 != '\0')) {
    QVar25 = *source;
    bVar4 = QRect::isNull(source);
    if (bVar4) {
      this_03 = QAbstractScrollArea::viewport((QAbstractScrollArea *)this);
      QVar25 = QWidget::rect(this_03);
    }
    local_148.xp = target->xp;
    local_148.yp = target->yp;
    local_148.w = target->w;
    local_148.h = target->h;
    RVar16 = QVar25.x1.m_i;
    RVar15 = QVar25.y1.m_i;
    if ((((target->w == 0.0) && (!NAN(target->w))) && (target->h == 0.0)) && (!NAN(target->h))) {
      plVar7 = (long *)QPainter::device();
      iVar6 = (**(code **)(*plVar7 + 0x10))(plVar7);
      if (iVar6 == 5) {
        local_148.xp = (qreal)RVar16.m_i;
        local_148.yp = (qreal)RVar15.m_i;
        local_148.h = (qreal)(((QVar25._8_8_ >> 0x20) - ((long)QVar25._0_8_ >> 0x20)) + 1);
        local_148.w = (double)(((long)QVar25.x2.m_i.m_i - (long)RVar16.m_i) + 1);
      }
      else {
        plVar7 = (long *)QPainter::device();
        iVar6 = (**(code **)(*plVar7 + 0x20))(plVar7,1);
        plVar7 = (long *)QPainter::device();
        iVar21 = (**(code **)(*plVar7 + 0x20))(plVar7,2);
        local_148.h = (qreal)iVar21;
        local_148.xp = 0.0;
        local_148.yp = 0.0;
        local_148.w = (double)iVar6;
      }
    }
    iVar6 = QVar25.x2.m_i.m_i + 1;
    dVar23 = local_148.w / (double)(iVar6 - RVar16.m_i);
    iVar21 = QVar25.y2.m_i.m_i + 1;
    dVar24 = local_148.h / (double)(iVar21 - RVar15.m_i);
    local_1d8 = dVar23;
    local_1d0 = dVar24;
    if (aspectRatioMode == KeepAspectRatioByExpanding) {
      local_1d8 = dVar24;
      if (dVar24 <= dVar23) {
        local_1d8 = dVar23;
        local_1d0 = dVar23;
      }
    }
    else if ((aspectRatioMode == KeepAspectRatio) && (local_1d0 = dVar23, dVar24 <= dVar23)) {
      local_1d8 = dVar24;
      local_1d0 = dVar24;
    }
    local_168.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_168.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_168.ptr = (QPointF *)&DAT_aaaaaaaaaaaaaaaa;
    moveMatrix.m_matrix[0][0] =
         (qreal)(((ulong)(RVar16.m_i - 1) | QVar25._0_8_ & 0xffffffff00000000) - 0x100000000);
    moveMatrix.m_matrix[0][1] = (qreal)CONCAT44(iVar21,iVar6);
    mapToScene((QPolygonF *)&local_168,this,(QRect *)&moveMatrix);
    local_188.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_188.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_188.ptr = (QGraphicsItem **)&DAT_aaaaaaaaaaaaaaaa;
    this_01 = (QGraphicsScene *)(this_00->scene).wp.value;
    pqVar17 = (qreal *)&DAT_0067b650;
    pQVar12 = &moveMatrix;
    for (lVar13 = 9; lVar13 != 0; lVar13 = lVar13 + -1) {
      pQVar12->m_matrix[0][0] = *pqVar17;
      pqVar17 = pqVar17 + (ulong)bVar22 * -2 + 1;
      pQVar12 = (QTransform *)((long)pQVar12 + ((ulong)bVar22 * -2 + 1) * 8);
    }
    moveMatrix._72_2_ = 0;
    QGraphicsScene::items
              ((QList<QGraphicsItem_*> *)&local_188,this_01,(QPolygonF *)&local_168,
               IntersectsItemBoundingRect,DescendingOrder,&moveMatrix);
    qVar3 = local_188.size;
    pvVar8 = operator_new__(local_188.size * 8);
    uVar9 = 0;
    uVar20 = 0;
    if (0 < (int)qVar3) {
      uVar20 = qVar3 & 0xffffffff;
    }
    lVar13 = qVar3 << 0x20;
    for (; lVar13 = lVar13 + -0x100000000, uVar20 != uVar9; uVar9 = uVar9 + 1) {
      *(QGraphicsItem **)((long)pvVar8 + (lVar13 >> 0x1d)) = local_188.ptr[uVar9];
    }
    QList<QGraphicsItem_*>::clear((QList<QGraphicsItem_*> *)&local_188);
    lVar13 = 10;
    pqVar17 = (qreal *)&DAT_0067b698;
    pQVar12 = &moveMatrix;
    for (lVar14 = lVar13; lVar14 != 0; lVar14 = lVar14 + -1) {
      pQVar12->m_matrix[0][0] = *pqVar17;
      pqVar17 = pqVar17 + (ulong)bVar22 * -2 + 1;
      pQVar12 = (QTransform *)((long)pQVar12 + ((ulong)bVar22 * -2 + 1) * 8);
    }
    qVar10 = QGraphicsViewPrivate::horizontalScroll(this_00);
    qVar11 = QGraphicsViewPrivate::verticalScroll(this_00);
    QTransform::fromTranslate((double)-qVar10,(double)-qVar11);
    pqVar17 = (qreal *)&DAT_0067b698;
    pQVar12 = &painterMatrix;
    for (; lVar13 != 0; lVar13 = lVar13 + -1) {
      pQVar12->m_matrix[0][0] = *pqVar17;
      pqVar17 = pqVar17 + (ulong)bVar22 * -2 + 1;
      pQVar12 = (QTransform *)((long)pQVar12 + ((ulong)bVar22 * -2 + 1) * 8);
    }
    QTransform::operator*(&painterMatrix,&this_00->matrix);
    puVar18 = &DAT_0067b650;
    pQVar19 = &local_128;
    for (lVar13 = 9; lVar13 != 0; lVar13 = lVar13 + -1) {
      uVar1 = *puVar18;
      pQVar19->x1 = (Representation)(int)uVar1;
      pQVar19->y1 = (Representation)(int)((ulong)uVar1 >> 0x20);
      puVar18 = puVar18 + (ulong)bVar22 * -2 + 1;
      pQVar19 = (QRect *)&pQVar19[-(ulong)bVar22].x2;
    }
    local_e0 = 0;
    QTransform::translate(local_148.xp,local_148.yp);
    QTransform::scale(local_1d8,local_1d0);
    pQVar12 = (QTransform *)QTransform::translate((double)-RVar16.m_i,(double)-RVar15.m_i);
    QTransform::operator*=(&painterMatrix,pQVar12);
    array = QGraphicsViewPrivate::allocStyleOptionsArray(this_00,(int)qVar3);
    option = array;
    for (uVar9 = 0; uVar20 != uVar9; uVar9 = uVar9 + 1) {
      this_02 = *(QGraphicsItemPrivate **)(*(long *)((long)pvVar8 + uVar9 * 8) + 8);
      local_128 = QRectF::toRect(&local_148);
      QRegion::QRegion((QRegion *)&path,&local_128,Rectangle);
      QGraphicsItemPrivate::initStyleOption(this_02,option,&painterMatrix,(QRegion *)&path,false);
      QRegion::~QRegion((QRegion *)&path);
      option = option + 1;
    }
    QPainter::save();
    QPainter::setClipRect((QRectF *)painter,(ClipOperation)&local_148);
    _path = &DAT_aaaaaaaaaaaaaaaa;
    QPainterPath::QPainterPath(&path);
    QPainterPath::addPolygon((QPolygonF *)&path);
    QPainterPath::closeSubpath();
    QTransform::map((QPainterPath *)&local_128);
    QPainter::setClipPath((QPainterPath *)painter,(ClipOperation)&local_128);
    QPainterPath::~QPainterPath((QPainterPath *)&local_128);
    QPainter::setTransform((QTransform *)painter,SUB81(&painterMatrix,0));
    local_118 = 0xffffffff;
    uStack_114 = 0xffffffff;
    uStack_110 = 0xffffffff;
    uStack_10c = 0xffffffff;
    local_128.x2.m_i = 0xffffffff;
    local_128.x1.m_i = -1;
    local_128.y1.m_i = -1;
    local_128.y2.m_i = -1;
    QPolygonF::boundingRect();
    (**(code **)(*(long *)this + 0x1c8))(this,painter,&local_128);
    (**(code **)(*(long *)this + 0x1d8))(this,painter,qVar3,pvVar8,array);
    (**(code **)(*(long *)this + 0x1d0))(this,painter,&local_128);
    operator_delete__(pvVar8);
    QGraphicsViewPrivate::freeStyleOptionsArray(this_00,array);
    QPainter::restore();
    QPainterPath::~QPainterPath(&path);
    QArrayDataPointer<QGraphicsItem_*>::~QArrayDataPointer(&local_188);
    QArrayDataPointer<QPointF>::~QArrayDataPointer(&local_168);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsView::render(QPainter *painter, const QRectF &target, const QRect &source,
                           Qt::AspectRatioMode aspectRatioMode)
{
    // ### Switch to using the recursive rendering algorithm instead.

    Q_D(QGraphicsView);
    if (!d->scene || !(painter && painter->isActive()))
        return;

    // Default source rect = viewport rect
    QRect sourceRect = source;
    if (source.isNull())
        sourceRect = viewport()->rect();

    // Default target rect = device rect
    QRectF targetRect = target;
    if (target.isNull()) {
        if (painter->device()->devType() == QInternal::Picture)
            targetRect = sourceRect;
        else
            targetRect.setRect(0, 0, painter->device()->width(), painter->device()->height());
    }

    // Find the ideal x / y scaling ratio to fit \a source into \a target.
    qreal xratio = targetRect.width() / sourceRect.width();
    qreal yratio = targetRect.height() / sourceRect.height();

    // Scale according to the aspect ratio mode.
    switch (aspectRatioMode) {
    case Qt::KeepAspectRatio:
        xratio = yratio = qMin(xratio, yratio);
        break;
    case Qt::KeepAspectRatioByExpanding:
        xratio = yratio = qMax(xratio, yratio);
        break;
    case Qt::IgnoreAspectRatio:
        break;
    }

    // Find all items to draw, and reverse the list (we want to draw
    // in reverse order).
    QPolygonF sourceScenePoly = mapToScene(sourceRect.adjusted(-1, -1, 1, 1));
    QList<QGraphicsItem *> itemList = d->scene->items(sourceScenePoly,
                                                      Qt::IntersectsItemBoundingRect);
    QGraphicsItem **itemArray = new QGraphicsItem *[itemList.size()];
    int numItems = itemList.size();
    for (int i = 0; i < numItems; ++i)
        itemArray[numItems - i - 1] = itemList.at(i);
    itemList.clear();

    // Setup painter matrix.
    QTransform moveMatrix = QTransform::fromTranslate(-d->horizontalScroll(), -d->verticalScroll());
    QTransform painterMatrix = d->matrix * moveMatrix;
    painterMatrix *= QTransform()
                     .translate(targetRect.left(), targetRect.top())
                     .scale(xratio, yratio)
                     .translate(-sourceRect.left(), -sourceRect.top());

    // Generate the style options
    QStyleOptionGraphicsItem *styleOptionArray = d->allocStyleOptionsArray(numItems);
    for (int i = 0; i < numItems; ++i)
        itemArray[i]->d_ptr->initStyleOption(&styleOptionArray[i], painterMatrix, targetRect.toRect());

    painter->save();

    // Clip in device coordinates to avoid QRegion transformations.
    painter->setClipRect(targetRect);
    QPainterPath path;
    path.addPolygon(sourceScenePoly);
    path.closeSubpath();
    painter->setClipPath(painterMatrix.map(path), Qt::IntersectClip);

    // Transform the painter.
    painter->setTransform(painterMatrix, true);

    // Render the scene.
    QRectF sourceSceneRect = sourceScenePoly.boundingRect();
    drawBackground(painter, sourceSceneRect);
    drawItems(painter, numItems, itemArray, styleOptionArray);
    drawForeground(painter, sourceSceneRect);

    delete [] itemArray;
    d->freeStyleOptionsArray(styleOptionArray);

    painter->restore();
}